

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O3

uint __thiscall ON_FixedSizePool::MaximumElementId(ON_FixedSizePool *this,size_t id_offset)

{
  uint uVar1;
  long *plVar2;
  char *sFormat;
  uint uVar3;
  int line_number;
  long lVar4;
  
  if (id_offset < 8) {
    sFormat = "id_offset is too small.";
    line_number = 0x3d3;
  }
  else {
    if (id_offset + 4 <= this->m_sizeof_element) {
      plVar2 = (long *)this->m_first_block;
      if (plVar2 == (long *)0x0) {
        return 0;
      }
      lVar4 = id_offset - this->m_sizeof_element;
      uVar3 = 0;
      do {
        if (plVar2 == (long *)this->m_al_block) {
          uVar1 = *(uint *)((long)this->m_al_element_array + lVar4);
          if (uVar1 <= uVar3) {
            return uVar3;
          }
          return uVar1;
        }
        uVar1 = *(uint *)(plVar2[1] + lVar4);
        if (uVar3 < uVar1) {
          uVar3 = uVar1;
        }
        plVar2 = (long *)*plVar2;
      } while (plVar2 != (long *)0x0);
      return uVar3;
    }
    sFormat = "id_offset is too large.";
    line_number = 0x3d9;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
             ,line_number,"",sFormat);
  return 0;
}

Assistant:

unsigned int ON_FixedSizePool::MaximumElementId(
  size_t id_offset
) const
{
  const char* block;
  const char* block_end;
  const char* next_block;
  unsigned int maximum_id = 0;
  if (id_offset < sizeof(void*))
  {
    // caller is confused.
    ON_ERROR("id_offset is too small.");
    return 0;
  }
  if (id_offset + sizeof(maximum_id) > m_sizeof_element)
  {
    // caller is confused.
    ON_ERROR("id_offset is too large.");
    return 0;
  }

  for (block = (const char*)m_first_block; 0 != block; block = next_block)
  {
    if (block == m_al_block)
    {
      next_block = nullptr;
      block_end = (const char*)m_al_element_array;
      block += (2 * sizeof(void*));
    }
    else
    {
      next_block = *((const char**)block);
      block += sizeof(void*);
      block_end = *((const char**)(block));
      block += sizeof(void*);
    }

    unsigned int i1 = *((const unsigned int*)(block_end-(m_sizeof_element-id_offset)));
    if (i1 > maximum_id)
      maximum_id = i1;
  }

  return maximum_id;
}